

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void CoreML::downgradeSpecificationVersion(Model *pModel)

{
  bool bVar1;
  int32 iVar2;
  TypeCase TVar3;
  int iVar4;
  PipelineRegressor *this;
  PipelineClassifier *this_00;
  Model *pModel_00;
  int local_20;
  int i;
  TypeCase modelType;
  Pipeline *pipeline;
  Model *pModel_local;
  
  if (pModel != (Model *)0x0) {
    iVar2 = Specification::Model::specificationversion(pModel);
    if ((iVar2 == 0) || (iVar2 = Specification::Model::specificationversion(pModel), 5 < iVar2)) {
      Specification::Model::set_specificationversion(pModel,5);
    }
    iVar2 = Specification::Model::specificationversion(pModel);
    if ((iVar2 == 5) && (bVar1 = hasIOS14Features(pModel), !bVar1)) {
      Specification::Model::set_specificationversion(pModel,4);
    }
    iVar2 = Specification::Model::specificationversion(pModel);
    if ((iVar2 == 4) && (bVar1 = hasIOS13Features(pModel), !bVar1)) {
      Specification::Model::set_specificationversion(pModel,3);
    }
    iVar2 = Specification::Model::specificationversion(pModel);
    if ((iVar2 == 3) && (bVar1 = hasIOS12Features(pModel), !bVar1)) {
      Specification::Model::set_specificationversion(pModel,2);
    }
    iVar2 = Specification::Model::specificationversion(pModel);
    if ((iVar2 == 2) && (bVar1 = hasIOS11_2Features(pModel), !bVar1)) {
      Specification::Model::set_specificationversion(pModel,1);
    }
    _i = (Pipeline *)0x0;
    TVar3 = Specification::Model::Type_case(pModel);
    if (TVar3 == kPipeline) {
      _i = Specification::Model::mutable_pipeline(pModel);
    }
    else if (TVar3 == kPipelineRegressor) {
      this = Specification::Model::mutable_pipelineregressor(pModel);
      _i = Specification::PipelineRegressor::mutable_pipeline(this);
    }
    else if (TVar3 == kPipelineClassifier) {
      this_00 = Specification::Model::mutable_pipelineclassifier(pModel);
      _i = Specification::PipelineClassifier::mutable_pipeline(this_00);
    }
    if (_i != (Pipeline *)0x0) {
      for (local_20 = 0; iVar4 = Specification::Pipeline::models_size(_i), local_20 < iVar4;
          local_20 = local_20 + 1) {
        pModel_00 = Specification::Pipeline::mutable_models(_i,local_20);
        downgradeSpecificationVersion(pModel_00);
      }
    }
  }
  return;
}

Assistant:

void CoreML::downgradeSpecificationVersion(Specification::Model *pModel) {

    if (!pModel) { return; }


    if (pModel->specificationversion() == 0 || pModel->specificationversion() > MLMODEL_SPECIFICATION_VERSION_NEWEST) {
        // If mistakenly set specification verion or never set and left as default
        // lets start at the newest specification version and downgrade from there
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_NEWEST);
    }


    if (pModel->specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS14 && !hasIOS14Features(*pModel)) {
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    }

    if (pModel->specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS13 && !hasIOS13Features(*pModel)) {
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS12);
    }

    if (pModel->specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS12 && !hasIOS12Features(*pModel)) {
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS11_2);
    }

    if (pModel->specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS11_2 && !hasIOS11_2Features(*pModel)) {
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS11);
    }

    ::CoreML::Specification::Pipeline *pipeline = NULL;
    auto modelType = pModel->Type_case();
    if (modelType == Specification::Model::kPipeline) {
        pipeline = pModel->mutable_pipeline();
    } else if (modelType == Specification::Model::kPipelineRegressor) {
        pipeline = pModel->mutable_pipelineregressor()->mutable_pipeline();
    } else if (modelType == Specification::Model::kPipelineClassifier) {
        pipeline = pModel->mutable_pipelineclassifier()->mutable_pipeline();
    }

    if (pipeline) {
        for (int i=0; i< pipeline->models_size(); i++) {
            downgradeSpecificationVersion(pipeline->mutable_models(i));
        }
    }

}